

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void row_mt_sync_mem_alloc(AV1EncRowMultiThreadSync *row_mt_sync,AV1_COMMON *cm,int rows)

{
  pthread_mutex_t *ppVar1;
  pthread_cond_t *ppVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar5 = (long)rows;
  ppVar1 = (pthread_mutex_t *)aom_malloc(lVar5 * 0x28);
  row_mt_sync->mutex_ = ppVar1;
  uVar7 = (ulong)(uint)rows;
  if (ppVar1 == (pthread_mutex_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate row_mt_sync->mutex_");
    if (row_mt_sync->mutex_ != (pthread_mutex_t *)0x0 && 0 < rows) goto LAB_001c43b6;
  }
  else if (0 < rows) {
LAB_001c43b6:
    lVar4 = 0;
    uVar6 = uVar7;
    do {
      pthread_mutex_init((pthread_mutex_t *)((long)row_mt_sync->mutex_ + lVar4),
                         (pthread_mutexattr_t *)0x0);
      lVar4 = lVar4 + 0x28;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  ppVar2 = (pthread_cond_t *)aom_malloc(lVar5 * 0x30);
  row_mt_sync->cond_ = ppVar2;
  if (ppVar2 == (pthread_cond_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate row_mt_sync->cond_");
    if (row_mt_sync->cond_ == (pthread_cond_t *)0x0 || rows < 1) goto LAB_001c4439;
  }
  else if (rows < 1) goto LAB_001c4439;
  lVar4 = 0;
  do {
    pthread_cond_init((pthread_cond_t *)((long)row_mt_sync->cond_ + lVar4),(pthread_condattr_t *)0x0
                     );
    lVar4 = lVar4 + 0x30;
    uVar7 = uVar7 - 1;
  } while (uVar7 != 0);
LAB_001c4439:
  piVar3 = (int *)aom_malloc(lVar5 << 2);
  row_mt_sync->num_finished_cols = piVar3;
  if (piVar3 == (int *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate row_mt_sync->num_finished_cols");
  }
  row_mt_sync->rows = rows;
  row_mt_sync->sync_range = 1;
  return;
}

Assistant:

static void row_mt_sync_mem_alloc(AV1EncRowMultiThreadSync *row_mt_sync,
                                  AV1_COMMON *cm, int rows) {
#if CONFIG_MULTITHREAD
  int i;

  CHECK_MEM_ERROR(cm, row_mt_sync->mutex_,
                  aom_malloc(sizeof(*row_mt_sync->mutex_) * rows));
  if (row_mt_sync->mutex_) {
    for (i = 0; i < rows; ++i) {
      pthread_mutex_init(&row_mt_sync->mutex_[i], NULL);
    }
  }

  CHECK_MEM_ERROR(cm, row_mt_sync->cond_,
                  aom_malloc(sizeof(*row_mt_sync->cond_) * rows));
  if (row_mt_sync->cond_) {
    for (i = 0; i < rows; ++i) {
      pthread_cond_init(&row_mt_sync->cond_[i], NULL);
    }
  }
#endif  // CONFIG_MULTITHREAD

  CHECK_MEM_ERROR(cm, row_mt_sync->num_finished_cols,
                  aom_malloc(sizeof(*row_mt_sync->num_finished_cols) * rows));

  row_mt_sync->rows = rows;
  // Set up nsync.
  row_mt_sync->sync_range = 1;
}